

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-intermediate.cxx
# Opt level: O0

int main(int argc,char **argv)

{
  undefined4 in_EDI;
  runtime_error *error;
  Solution *in_stack_00000060;
  ProblemGraph *in_stack_00000068;
  SolutionGraph solutionGraph;
  Solution solution;
  ProblemGraph problemGraph;
  Problem problem;
  Parameters parameters;
  string *in_stack_000002d8;
  SolutionGraph *in_stack_000002e0;
  char **in_stack_00000540;
  undefined4 in_stack_00000548;
  int in_stack_0000054c;
  SolutionGraph *in_stack_00000550;
  ProblemGraph *in_stack_fffffffffffffdb0;
  string *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  string local_208 [80];
  Problem *in_stack_fffffffffffffe48;
  ProblemGraph *in_stack_fffffffffffffe50;
  string local_30 [40];
  undefined4 uVar1;
  int iVar2;
  
  uVar1 = 0;
  parseCommandLine(in_stack_0000054c,in_stack_00000540);
  lineage::loadProblem(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  lineage::ProblemGraph::ProblemGraph(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  lineage::loadSolution((string *)CONCAT44(uVar1,in_EDI));
  lineage::SolutionGraph::SolutionGraph
            ((SolutionGraph *)solutionGraph.problemGraph_,in_stack_00000068,in_stack_00000060);
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_208,(ulong)local_30);
  std::__cxx11::string::operator=(local_30,local_208);
  std::__cxx11::string::~string(local_208);
  lineage::SolutionGraph::save
            (in_stack_00000550,(string *)CONCAT44(in_stack_0000054c,in_stack_00000548));
  std::operator+(in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0);
  lineage::SolutionGraph::saveSVG(in_stack_000002e0,in_stack_000002d8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
  iVar2 = 0;
  lineage::SolutionGraph::~SolutionGraph((SolutionGraph *)in_stack_fffffffffffffdb0);
  lineage::Solution::~Solution((Solution *)0x135435);
  lineage::ProblemGraph::~ProblemGraph(in_stack_fffffffffffffdb0);
  lineage::Problem::~Problem((Problem *)in_stack_fffffffffffffdb0);
  Parameters::~Parameters((Parameters *)in_stack_fffffffffffffdb0);
  return iVar2;
}

Assistant:

int main(int argc, char** argv)
try
{
    auto parameters = parseCommandLine(argc, argv);

    // load problem:
    auto problem = lineage::loadProblem(parameters.nodesFileName, parameters.edgesFileName);

    lineage::ProblemGraph problemGraph(problem);

    auto solution = lineage::loadSolution(parameters.solutionName);
    
    lineage::SolutionGraph solutionGraph(problemGraph, solution);

    parameters.solutionName = parameters.solutionName.substr(0, parameters.solutionName.size() - 4);
    solutionGraph.save(parameters.solutionName);
    solutionGraph.saveSVG(parameters.solutionName + "-lineage-tree.svg");

    return 0;
}
catch(const runtime_error& error) {
    cerr << "error: " << error.what() << endl;
    return 1;
}